

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::InsertAfter(Instr *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (instr->m_next != (Instr *)0x0 || instr->m_prev != (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xdf,"(!instr->IsLinked())","!instr->IsLinked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pIVar1 = this->m_next;
  instr->m_next = pIVar1;
  this->m_next = instr;
  if (pIVar1 != (Instr *)0x0) {
    pIVar1->m_prev = instr;
  }
  instr->m_prev = this;
  return;
}

Assistant:

void
Instr::InsertAfter(Instr *instr)
{
    Assert(!instr->IsLinked());

    Instr * nextInstr = this->m_next;
    instr->m_next = nextInstr;
    this->m_next = instr;

    if (nextInstr)
    {
        nextInstr->m_prev = instr;
    }
    instr->m_prev = this;
}